

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsMouseClicked(ImGuiMouseButton button,bool repeat)

{
  float *pfVar1;
  float t1;
  int iVar2;
  bool local_29;
  int amount;
  float t;
  ImGuiContext *g;
  bool repeat_local;
  ImGuiMouseButton button_local;
  
  local_29 = 4 < (uint)button;
  if (local_29) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x11c5,"bool ImGui::IsMouseClicked(ImGuiMouseButton, bool)");
  }
  t1 = (GImGui->IO).MouseDownDuration[button];
  if ((t1 != 0.0) || (NAN(t1))) {
    if ((!repeat) ||
       ((pfVar1 = &(GImGui->IO).KeyRepeatDelay, t1 < *pfVar1 || t1 == *pfVar1 ||
        (iVar2 = CalcTypematicRepeatAmount
                           (t1 - (GImGui->IO).DeltaTime,t1,(GImGui->IO).KeyRepeatDelay,
                            (GImGui->IO).KeyRepeatRate * 0.5), iVar2 < 1)))) {
      repeat_local = false;
    }
    else {
      repeat_local = true;
    }
  }
  else {
    repeat_local = true;
  }
  return repeat_local;
}

Assistant:

bool ImGui::IsMouseClicked(ImGuiMouseButton button, bool repeat)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    const float t = g.IO.MouseDownDuration[button];
    if (t == 0.0f)
        return true;

    if (repeat && t > g.IO.KeyRepeatDelay)
    {
        // FIXME: 2019/05/03: Our old repeat code was wrong here and led to doubling the repeat rate, which made it an ok rate for repeat on mouse hold.
        int amount = CalcTypematicRepeatAmount(t - g.IO.DeltaTime, t, g.IO.KeyRepeatDelay, g.IO.KeyRepeatRate * 0.50f);
        if (amount > 0)
            return true;
    }
    return false;
}